

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<kj::AuthenticatedStream> __thiscall
kj::ConnectionReceiver::acceptAuthenticated(ConnectionReceiver *this)

{
  PromiseArena *pPVar1;
  void *pvVar2;
  undefined8 *in_RSI;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode local_38;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  (**(code **)*in_RSI)(&local_38);
  pPVar1 = ((local_38.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_38.ptr - (long)pPVar1) < 0x28) {
    pvVar2 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar2 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_38,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:3288:24)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar2 + 0x3d8) = &PTR_destroy_0059b4b8;
    *(void **)((long)pvVar2 + 0x3e0) = pvVar2;
  }
  else {
    ((local_38.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)&local_38.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_38,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:3288:24)>
               ::anon_class_1_0_00000001_for_func::operator());
    local_38.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_0059b4b8;
    local_38.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_30.ptr = (PromiseNode *)0x0;
  this->_vptr_ConnectionReceiver = (_func_int **)this_00;
  local_28.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_30);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<AuthenticatedStream> ConnectionReceiver::acceptAuthenticated() {
  return accept().then([](Own<AsyncIoStream> stream) {
    return AuthenticatedStream { kj::mv(stream), UnknownPeerIdentity::newInstance() };
  });
}